

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O3

SQFunctionProto *
SQFunctionProto::Create
          (SQSharedState *ss,SQInteger ninstructions,SQInteger nliterals,SQInteger nparameters,
          SQInteger nfunctions,SQInteger noutervalues,SQInteger nlineinfos,SQInteger nlocalvarinfos,
          SQInteger ndefaultparams)

{
  undefined8 *puVar1;
  SQObjectPtr *pSVar2;
  SQFunctionProto *this;
  SQInstruction *pSVar3;
  long lVar4;
  long lVar5;
  SQLocalVarInfo *pSVar6;
  SQOuterVar *pSVar7;
  
  this = (SQFunctionProto *)
         sq_vm_malloc((nparameters + nliterals + nfunctions + nlineinfos) * 0x10 +
                      (nlocalvarinfos + noutervalues) * 0x28 + (ndefaultparams + ninstructions) * 8
                      + 0xe0);
  SQFunctionProto(this,ss);
  this->_ninstructions = ninstructions;
  this->_literals = (SQObjectPtr *)(this->_instructions + ninstructions);
  this->_nliterals = nliterals;
  pSVar3 = this->_instructions + ninstructions + nliterals * 2;
  this->_parameters = (SQObjectPtr *)pSVar3;
  this->_nparameters = nparameters;
  pSVar3 = pSVar3 + nparameters * 2;
  this->_functions = (SQObjectPtr *)pSVar3;
  this->_nfunctions = nfunctions;
  pSVar7 = (SQOuterVar *)(pSVar3 + nfunctions * 2);
  this->_outervalues = pSVar7;
  this->_noutervalues = noutervalues;
  this->_lineinfos = (SQLineInfo *)(pSVar7 + noutervalues);
  this->_nlineinfos = nlineinfos;
  pSVar6 = (SQLocalVarInfo *)(&pSVar7[noutervalues]._type + nlineinfos * 4);
  this->_localvarinfos = pSVar6;
  this->_nlocalvarinfos = nlocalvarinfos;
  this->_defaultparams = (SQInteger *)(pSVar6 + nlocalvarinfos);
  this->_ndefaultparams = ndefaultparams;
  if (0 < nliterals) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pSVar2 = this->_literals;
      *(undefined4 *)((long)pSVar2 + lVar4 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar4) = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < this->_nliterals);
    nparameters = this->_nparameters;
  }
  if (0 < nparameters) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pSVar2 = this->_parameters;
      *(undefined4 *)((long)pSVar2 + lVar4 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar4) = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < this->_nparameters);
  }
  if (0 < this->_nfunctions) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pSVar2 = this->_functions;
      *(undefined4 *)((long)pSVar2 + lVar4 + -8) = 0x1000001;
      *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar4) = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < this->_nfunctions);
  }
  if (0 < this->_noutervalues) {
    lVar4 = 0x20;
    lVar5 = 0;
    do {
      pSVar7 = this->_outervalues;
      *(undefined4 *)((long)pSVar7 + lVar4 + -0x18) = 0x1000001;
      *(undefined8 *)((long)pSVar7 + lVar4 + -0x10) = 0;
      *(undefined4 *)((long)pSVar7 + lVar4 + -8) = 0x1000001;
      *(undefined8 *)((long)&pSVar7->_type + lVar4) = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < this->_noutervalues);
  }
  if (0 < this->_nlocalvarinfos) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pSVar6 = this->_localvarinfos;
      *(undefined4 *)((long)pSVar6 + lVar4 + -8) = 0x1000001;
      puVar1 = (undefined8 *)((long)&(pSVar6->_name).super_SQObject._type + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pSVar6->_start_op + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < this->_nlocalvarinfos);
  }
  return this;
}

Assistant:

static SQFunctionProto *Create(SQSharedState *ss,SQInteger ninstructions,
        SQInteger nliterals,SQInteger nparameters,
        SQInteger nfunctions,SQInteger noutervalues,
        SQInteger nlineinfos,SQInteger nlocalvarinfos,SQInteger ndefaultparams)
    {
        SQFunctionProto *f;
        //I compact the whole class and members in a single memory allocation
        f = (SQFunctionProto *)sq_vm_malloc(_FUNC_SIZE(ninstructions,nliterals,nparameters,nfunctions,noutervalues,nlineinfos,nlocalvarinfos,ndefaultparams));
        new (f) SQFunctionProto(ss);
        f->_ninstructions = ninstructions;
        f->_literals = (SQObjectPtr*)&f->_instructions[ninstructions];
        f->_nliterals = nliterals;
        f->_parameters = (SQObjectPtr*)&f->_literals[nliterals];
        f->_nparameters = nparameters;
        f->_functions = (SQObjectPtr*)&f->_parameters[nparameters];
        f->_nfunctions = nfunctions;
        f->_outervalues = (SQOuterVar*)&f->_functions[nfunctions];
        f->_noutervalues = noutervalues;
        f->_lineinfos = (SQLineInfo *)&f->_outervalues[noutervalues];
        f->_nlineinfos = nlineinfos;
        f->_localvarinfos = (SQLocalVarInfo *)&f->_lineinfos[nlineinfos];
        f->_nlocalvarinfos = nlocalvarinfos;
        f->_defaultparams = (SQInteger *)&f->_localvarinfos[nlocalvarinfos];
        f->_ndefaultparams = ndefaultparams;

        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nliterals,f->_literals);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nparameters,f->_parameters);
        _CONSTRUCT_VECTOR(SQObjectPtr,f->_nfunctions,f->_functions);
        _CONSTRUCT_VECTOR(SQOuterVar,f->_noutervalues,f->_outervalues);
        //_CONSTRUCT_VECTOR(SQLineInfo,f->_nlineinfos,f->_lineinfos); //not required are 2 integers
        _CONSTRUCT_VECTOR(SQLocalVarInfo,f->_nlocalvarinfos,f->_localvarinfos);
        return f;
    }